

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

void bcf_sr_destroy(bcf_srs_t *files)

{
  int local_14;
  int i;
  bcf_srs_t *files_local;
  
  for (local_14 = 0; local_14 < files->nreaders; local_14 = local_14 + 1) {
    bcf_sr_destroy1(files->readers + local_14);
  }
  free(files->has_line);
  free(files->readers);
  for (local_14 = 0; local_14 < files->n_smpl; local_14 = local_14 + 1) {
    free(files->samples[local_14]);
  }
  free(files->samples);
  if (files->targets != (bcf_sr_regions_t *)0x0) {
    bcf_sr_regions_destroy(files->targets);
  }
  if (files->regions != (bcf_sr_regions_t *)0x0) {
    bcf_sr_regions_destroy(files->regions);
  }
  if ((files->tmps).m != 0) {
    free((files->tmps).s);
  }
  free(files);
  return;
}

Assistant:

void bcf_sr_destroy(bcf_srs_t *files)
{
    int i;
    for (i=0; i<files->nreaders; i++)
        bcf_sr_destroy1(&files->readers[i]);
    free(files->has_line);
    free(files->readers);
    for (i=0; i<files->n_smpl; i++) free(files->samples[i]);
    free(files->samples);
    if (files->targets) bcf_sr_regions_destroy(files->targets);
    if (files->regions) bcf_sr_regions_destroy(files->regions);
    if ( files->tmps.m ) free(files->tmps.s);
    free(files);
}